

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

uint32_t __thiscall
xatlas::internal::
HashMap<unsigned_int,_xatlas::internal::Hash<unsigned_int>,_xatlas::internal::Equal<unsigned_int>_>
::getNext(HashMap<unsigned_int,_xatlas::internal::Hash<unsigned_int>,_xatlas::internal::Equal<unsigned_int>_>
          *this,uint32_t current)

{
  uint32_t index;
  uint32_t *puVar1;
  uint *puVar2;
  uint *puVar3;
  
  puVar1 = Array<unsigned_int>::operator[](&this->m_next,current);
  while( true ) {
    index = *puVar1;
    if (index == 0xffffffff) {
      return 0xffffffff;
    }
    puVar2 = Array<unsigned_int>::operator[](&this->m_keys,index);
    puVar3 = Array<unsigned_int>::operator[](&this->m_keys,current);
    if (*puVar2 == *puVar3) break;
    puVar1 = Array<unsigned_int>::operator[](&this->m_next,index);
  }
  return index;
}

Assistant:

uint32_t getNext(uint32_t current) const
	{
		uint32_t i = m_next[current];
		E equal;
		while (i != UINT32_MAX) {
			if (equal(m_keys[i], m_keys[current]))
				return i;
			i = m_next[i];
		}
		return UINT32_MAX;
	}